

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O3

Abc_Obj_t * Abc_NtkBddMux412(Abc_Ntk_t *pNtkNew,Abc_Obj_t **pFanins)

{
  DdManager *dd;
  Abc_Obj_t *pObj;
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  Abc_Obj_t *pObj_00;
  DdNode *h;
  
  dd = (DdManager *)pNtkNew->pManFunc;
  pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
  Abc_ObjAddFanin(pObj,*pFanins);
  Abc_ObjAddFanin(pObj,pFanins[1]);
  Abc_ObjAddFanin(pObj,pFanins[2]);
  Abc_ObjAddFanin(pObj,pFanins[3]);
  pDVar1 = Cudd_bddIthVar(dd,0);
  pDVar2 = Cudd_bddIthVar(dd,1);
  pDVar3 = Cudd_bddIthVar(dd,3);
  pDVar4 = Cudd_bddIthVar(dd,2);
  pDVar2 = Cudd_bddIte(dd,pDVar2,pDVar3,pDVar4);
  Cudd_Ref(pDVar2);
  pDVar3 = Cudd_bddIthVar(dd,1);
  pDVar1 = Cudd_bddIte(dd,pDVar1,pDVar3,pDVar2);
  (pObj->field_5).pData = pDVar1;
  Cudd_Ref(pDVar1);
  Cudd_RecursiveDeref(dd,pDVar2);
  pObj_00 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
  Abc_ObjAddFanin(pObj_00,*pFanins);
  Abc_ObjAddFanin(pObj_00,pObj);
  Abc_ObjAddFanin(pObj_00,pFanins[4]);
  Abc_ObjAddFanin(pObj_00,pFanins[5]);
  pDVar1 = Cudd_bddIthVar(dd,0);
  pDVar2 = Cudd_bddIthVar(dd,1);
  pDVar3 = Cudd_bddIthVar(dd,1);
  pDVar4 = Cudd_bddIthVar(dd,3);
  h = Cudd_bddIthVar(dd,2);
  pDVar3 = Cudd_bddIte(dd,pDVar3,pDVar4,h);
  Cudd_Ref(pDVar3);
  pDVar1 = Cudd_bddIte(dd,pDVar1,pDVar3,pDVar2);
  (pObj_00->field_5).pData = pDVar1;
  Cudd_Ref(pDVar1);
  Cudd_RecursiveDeref(dd,pDVar3);
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NtkBddMux412( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pFanins[] )
{
    DdManager * dd = (DdManager *)pNtkNew->pManFunc;
    Abc_Obj_t * pNodeBot, * pNodeTop;
    DdNode * bSpin, * bCof0, * bCof1;
    // bottom node
    pNodeBot = Abc_NtkCreateNode( pNtkNew );
    Abc_ObjAddFanin( pNodeBot, pFanins[0] );
    Abc_ObjAddFanin( pNodeBot, pFanins[1] );
    Abc_ObjAddFanin( pNodeBot, pFanins[2] );
    Abc_ObjAddFanin( pNodeBot, pFanins[3] );
    bSpin = Cudd_bddIthVar(dd, 0);
    bCof0 = Cudd_bddIte( dd, Cudd_bddIthVar(dd, 1), Cudd_bddIthVar(dd, 3), Cudd_bddIthVar(dd, 2) ); Cudd_Ref( bCof0 );
    bCof1 = Cudd_bddIthVar(dd, 1);
    pNodeBot->pData = Cudd_bddIte( dd, bSpin, bCof1, bCof0 );  Cudd_Ref( (DdNode *)pNodeBot->pData ); 
    Cudd_RecursiveDeref( dd, bCof0 );
    // top node
    pNodeTop = Abc_NtkCreateNode( pNtkNew );
    Abc_ObjAddFanin( pNodeTop, pFanins[0] );
    Abc_ObjAddFanin( pNodeTop, pNodeBot   );
    Abc_ObjAddFanin( pNodeTop, pFanins[4] );
    Abc_ObjAddFanin( pNodeTop, pFanins[5] );
    bSpin = Cudd_bddIthVar(dd, 0);
    bCof0 = Cudd_bddIthVar(dd, 1);
    bCof1 = Cudd_bddIte( dd, Cudd_bddIthVar(dd, 1), Cudd_bddIthVar(dd, 3), Cudd_bddIthVar(dd, 2) ); Cudd_Ref( bCof1 );
    pNodeTop->pData = Cudd_bddIte( dd, bSpin, bCof1, bCof0 );  Cudd_Ref( (DdNode *)pNodeTop->pData ); 
    Cudd_RecursiveDeref( dd, bCof1 );
    return pNodeTop;
}